

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O1

void swrenderer::R_DrawPlayerSprites(void)

{
  extsector_t *peVar1;
  lightlist_t *plVar2;
  F3DFloor *pFVar3;
  secplane_t *psVar4;
  AActor *pAVar5;
  DPSprite *pspr;
  sector_t_conflict *psVar6;
  DPSprite *pDVar7;
  sector_t *psVar8;
  uint uVar9;
  FDynamicColormap **ppFVar10;
  uint uVar11;
  int ceilinglight;
  int floorlight;
  float boby;
  float bobx;
  int local_50;
  int local_4c;
  double local_48;
  double local_40;
  float local_38;
  float local_34;
  undefined8 local_30;
  
  if (R_DrawPlayerSprites()::tempsec == '\0') {
    R_DrawPlayerSprites();
  }
  local_30 = CenterY;
  if (((((camera != (AActor *)0x0 & r_drawplayersprites.Value) == 1) &&
       (camera->player != (player_t *)0x0)) &&
      ((*(byte *)(&DAT_017e5f38 + (long)consoleplayer * 0xa8) & 0x20) == 0)) &&
     ((r_deathcamera.Value != true || (0 < camera->health)))) {
    if ((fixedlightlev < 0) &&
       ((peVar1 = viewsector->e, peVar1 != (extsector_t *)0x0 &&
        (uVar9 = (peVar1->XFloor).lightlist.Count, uVar9 != 0)))) {
      psVar8 = (sector_t *)0x0;
      do {
        uVar9 = uVar9 - 1;
        if ((int)uVar9 < 0) goto LAB_002ee198;
        uVar11 = uVar9 & 0x7fffffff;
        plVar2 = (peVar1->XFloor).lightlist.Array;
      } while (plVar2[uVar11].plane.D * plVar2[uVar11].plane.negiC < ViewPos.Z);
      pFVar3 = plVar2[uVar11].caster;
      if ((pFVar3 == (F3DFloor *)0x0) ||
         (((pFVar3->flags >> 0x10 & 1) != 0 &&
          (psVar4 = (pFVar3->bottom).plane, ViewPos.Z <= psVar4->D * psVar4->negiC)))) {
        psVar8 = (sector_t *)0x0;
      }
      else {
        psVar8 = pFVar3->model;
        ppFVar10 = &psVar8->ColorMap;
        if ((pFVar3->flags >> 0x1b & 1) == 0) {
          ppFVar10 = &plVar2[uVar11].extra_colormap;
        }
        basecolormap = *ppFVar10;
      }
LAB_002ee198:
      if (psVar8 == (sector_t *)0x0) {
        basecolormap = viewsector->ColorMap;
        psVar8 = viewsector;
      }
      local_50 = (int)psVar8->lightlevel;
      local_4c = local_50;
    }
    else {
      psVar6 = R_FakeFlat((sector_t_conflict *)viewsector,&R_DrawPlayerSprites::tempsec,&local_4c,
                          &local_50,false);
      basecolormap = psVar6->ColorMap;
    }
    foggy = 1;
    if ((level.fadeto == 0) && ((basecolormap->Fade).field_0.d == 0)) {
      foggy = ((byte)level.flags & 8) >> 3;
    }
    r_actualextralight = 0;
    if (foggy == 0) {
      r_actualextralight = extralight << 4;
    }
    spriteshade = (((uint)(local_50 + local_4c) >> 1) + r_actualextralight) * -0x4000 + 0x250000;
    mfloorclip = &screenheightarray;
    mceilingclip = zeroarray;
    local_30 = CenterY;
    if (camera->player != (player_t *)0x0) {
      CenterY = (double)(viewheight / 2);
      P_BobWeapon(camera->player,&local_34,&local_38,r_TicFracF);
      pDVar7 = player_t::FindPSprite(camera->player,1);
      if (pDVar7 == (DPSprite *)0x0) {
        local_48 = 0.0;
        local_40 = 0.0;
      }
      else if (pDVar7->firstTic == true) {
        local_40 = pDVar7->x;
        local_48 = pDVar7->y;
      }
      else {
        local_40 = (pDVar7->x - pDVar7->oldx) * r_TicFracF + pDVar7->oldx;
        local_48 = (pDVar7->y - pDVar7->oldy) * r_TicFracF + pDVar7->oldy;
      }
      pDVar7 = (camera->player->psprites).field_0.p;
      if ((pDVar7 != (DPSprite *)0x0) && (((pDVar7->super_DObject).ObjectFlags & 0x20) != 0)) {
        (camera->player->psprites).field_0.p = (DPSprite *)0x0;
        pDVar7 = (DPSprite *)0x0;
      }
      while (pspr = pDVar7, pspr != (DPSprite *)0x0) {
        if (((pspr->ID != 0x7ffffffd) || (CrosshairImage == (FTexture *)0x0)) &&
           (pAVar5 = (pspr->Caller).field_0.p, pAVar5 != (AActor *)0x0)) {
          if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
            R_DrawPSprite(pspr,camera,local_34,local_38,local_40,local_48,r_TicFracF);
          }
          else {
            (pspr->Caller).field_0.p = (AActor *)0x0;
          }
        }
        pDVar7 = (pspr->Next).field_0.p;
        if ((pDVar7 != (DPSprite *)0x0) && (((pDVar7->super_DObject).ObjectFlags & 0x20) != 0)) {
          (pspr->Next).field_0.p = (DPSprite *)0x0;
          pDVar7 = (DPSprite *)0x0;
        }
      }
    }
  }
  CenterY = (double)local_30;
  return;
}

Assistant:

void R_DrawPlayerSprites ()
{
	int 		i;
	int 		lightnum;
	DPSprite*	psp;
	DPSprite*	weapon;
	sector_t*	sec = NULL;
	static sector_t tempsec;
	int			floorlight, ceilinglight;
	F3DFloor *rover;

	if (!r_drawplayersprites ||
		!camera ||
		!camera->player ||
		(players[consoleplayer].cheats & CF_CHASECAM) ||
		(r_deathcamera && camera->health <= 0))
		return;

	if (fixedlightlev < 0 && viewsector->e && viewsector->e->XFloor.lightlist.Size())
	{
		for (i = viewsector->e->XFloor.lightlist.Size() - 1; i >= 0; i--)
		{
			if (ViewPos.Z <= viewsector->e->XFloor.lightlist[i].plane.Zat0())
			{
				rover = viewsector->e->XFloor.lightlist[i].caster;
				if (rover)
				{
					if (rover->flags & FF_DOUBLESHADOW && ViewPos.Z <= rover->bottom.plane->Zat0())
						break;
					sec = rover->model;
					if (rover->flags & FF_FADEWALLS)
						basecolormap = sec->ColorMap;
					else
						basecolormap = viewsector->e->XFloor.lightlist[i].extra_colormap;
				}
				break;
			}
		}
		if(!sec)
		{
			sec = viewsector;
			basecolormap = sec->ColorMap;
		}
		floorlight = ceilinglight = sec->lightlevel;
	}
	else
	{	// This used to use camera->Sector but due to interpolation that can be incorrect
		// when the interpolated viewpoint is in a different sector than the camera.
		sec = R_FakeFlat (viewsector, &tempsec, &floorlight,
			&ceilinglight, false);

		// [RH] set basecolormap
		basecolormap = sec->ColorMap;
	}

	// [RH] set foggy flag
	foggy = (level.fadeto || basecolormap->Fade || (level.flags & LEVEL_HASFADETABLE));
	r_actualextralight = foggy ? 0 : extralight << 4;

	// get light level
	lightnum = ((floorlight + ceilinglight) >> 1) + r_actualextralight;
	spriteshade = LIGHT2SHADE(lightnum) - 24*FRACUNIT;

	// clip to screen bounds
	mfloorclip = screenheightarray;
	mceilingclip = zeroarray;

	if (camera->player != NULL)
	{
		double centerhack = CenterY;
		double wx, wy;
		float bobx, boby;

		CenterY = viewheight / 2;

		P_BobWeapon (camera->player, &bobx, &boby, r_TicFracF);

		// Interpolate the main weapon layer once so as to be able to add it to other layers.
		if ((weapon = camera->player->FindPSprite(PSP_WEAPON)) != nullptr)
		{
			if (weapon->firstTic)
			{
				wx = weapon->x;
				wy = weapon->y;
			}
			else
			{
				wx = weapon->oldx + (weapon->x - weapon->oldx) * r_TicFracF;
				wy = weapon->oldy + (weapon->y - weapon->oldy) * r_TicFracF;
			}
		}
		else
		{
			wx = 0;
			wy = 0;
		}

		// add all active psprites
		psp = camera->player->psprites;
		while (psp)
		{
			// [RH] Don't draw the targeter's crosshair if the player already has a crosshair set.
			// It's possible this psprite's caller is now null but the layer itself hasn't been destroyed
			// because it didn't tick yet (if we typed 'take all' while in the console for example).
			// In this case let's simply not draw it to avoid crashing.
			if ((psp->GetID() != PSP_TARGETCENTER || CrosshairImage == nullptr) && psp->GetCaller() != nullptr)
			{
				R_DrawPSprite(psp, camera, bobx, boby, wx, wy, r_TicFracF);
			}

			psp = psp->GetNext();
		}

		CenterY = centerhack;
	}
}